

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,char *desc_align
          ,char *desc_memidx,char *desc_offset,uint8_t *lane_val)

{
  Result RVar1;
  uint local_3c;
  Index local_38;
  uint local_34;
  
  RVar1 = ReadU32Leb128(this,&local_3c,desc_align);
  if (RVar1.enum_ != Error) {
    *alignment_log2 = (ulong)(local_3c & 0xffffffbf);
    if ((local_3c & 0xffffffbf) < 0x20) {
      *memidx = 0;
      if ((local_3c & 0x40) == 0) {
LAB_0012bcb5:
        if ((this->options_->features).memory64_enabled_ == true) {
          RVar1 = ReadU64Leb128(this,offset,desc_offset);
        }
        else {
          RVar1 = ReadU32Leb128(this,&local_34,desc_offset);
          *offset = (ulong)local_34;
        }
        if (RVar1.enum_ == Error) {
          return (Result)Error;
        }
        if ((lane_val != (uint8_t *)0x0) &&
           (RVar1 = ReadU8(this,lane_val,"Lane idx"), RVar1.enum_ == Error)) {
          return (Result)Error;
        }
        return (Result)Ok;
      }
      if ((this->options_->features).multi_memory_enabled_ == false) {
        PrintError(this,"multi_memory not allowed");
      }
      else {
        RVar1 = ReadU32Leb128(this,&local_38,desc_memidx);
        if (RVar1.enum_ != Error) {
          *memidx = local_38;
          goto LAB_0012bcb5;
        }
      }
    }
    else {
      PrintError(this,"invalid %s: %u",desc_align);
    }
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadMemLocation(Address* alignment_log2,
                                     Index* memidx,
                                     Address* offset,
                                     const char* desc_align,
                                     const char* desc_memidx,
                                     const char* desc_offset,
                                     uint8_t* lane_val) {
  bool has_memidx = false;
  CHECK_RESULT(ReadAlignment(alignment_log2, desc_align));
  CHECK_RESULT(TakeHasMemidx(alignment_log2, &has_memidx));
  CHECK_RESULT(CheckAlignment(alignment_log2, desc_align));
  *memidx = 0;
  if (has_memidx) {
    ERROR_IF(!options_.features.multi_memory_enabled(),
             "multi_memory not allowed");
    CHECK_RESULT(ReadMemidx(memidx, desc_memidx));
  }
  CHECK_RESULT(ReadAddress(offset, 0, desc_offset));

  if (lane_val) {
    CHECK_RESULT(ReadU8(lane_val, "Lane idx"));
  }

  return Result::Ok;
}